

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O0

void __thiscall xmrig::SelfSelectClient::setState(SelfSelectClient *this,State state)

{
  uint64_t uVar1;
  int in_ESI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x150) != in_ESI) {
    if (in_ESI == 0) {
      *(undefined8 *)(in_RDI + 0x160) = 0;
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    else if (in_ESI == 1) {
      uVar1 = Chrono::steadyMSecs();
      *(uint64_t *)(in_RDI + 0x160) = uVar1;
    }
    else if (in_ESI == 2) {
      uVar1 = Chrono::steadyMSecs();
      *(uint64_t *)(in_RDI + 0x160) = uVar1;
      if ((long)*(int *)(in_RDI + 0x30) < *(long *)(in_RDI + 0x38)) {
        (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))
                  (*(long **)(in_RDI + 0x28),in_RDI,*(ulong *)(in_RDI + 0x38) & 0xffffffff);
      }
      *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
    }
    *(int *)(in_RDI + 0x150) = in_ESI;
  }
  return;
}

Assistant:

void xmrig::SelfSelectClient::setState(State state)
{
    if (m_state == state) {
        return;
    }

    switch (state) {
    case IdleState:
        m_timestamp = 0;
        m_failures  = 0;
        break;

    case WaitState:
        m_timestamp = Chrono::steadyMSecs();
        break;

    case RetryState:
        m_timestamp = Chrono::steadyMSecs();

        if (m_failures > m_retries) {
            m_listener->onClose(this, static_cast<int>(m_failures));
        }

        m_failures++;
        break;
    }

    m_state = state;
}